

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O0

void load_buffer_4x4(int16_t *input,__m128i *in,int stride,int flipud,int fliplr,int shift)

{
  __m128i alVar1;
  longlong local_c8;
  longlong local_b8;
  longlong local_a8;
  longlong local_98;
  int shift_local;
  int fliplr_local;
  int flipud_local;
  int stride_local;
  __m128i *in_local;
  int16_t *input_local;
  int local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  int local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  int local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  
  if (flipud == 0) {
    (*in)[0] = *(longlong *)input;
    (*in)[1] = 0;
    in[1][0] = *(longlong *)(input + stride);
    in[1][1] = 0;
    in[2][0] = *(longlong *)(input + stride * 2);
    in[2][1] = 0;
    in[3][0] = *(longlong *)(input + stride * 3);
    in[3][1] = 0;
  }
  else {
    (*in)[0] = *(longlong *)(input + stride * 3);
    (*in)[1] = 0;
    in[1][0] = *(longlong *)(input + stride * 2);
    in[1][1] = 0;
    in[2][0] = *(longlong *)(input + stride);
    in[2][1] = 0;
    in[3][0] = *(longlong *)input;
    in[3][1] = 0;
  }
  if (fliplr != 0) {
    alVar1 = (__m128i)pshuflw((undefined1  [16])*in,(undefined1  [16])*in,0x1b);
    *in = alVar1;
    alVar1 = (__m128i)pshuflw((undefined1  [16])in[1],(undefined1  [16])in[1],0x1b);
    in[1] = alVar1;
    alVar1 = (__m128i)pshuflw((undefined1  [16])in[2],(undefined1  [16])in[2],0x1b);
    in[2] = alVar1;
    alVar1 = (__m128i)pshuflw((undefined1  [16])in[3],(undefined1  [16])in[3],0x1b);
    in[3] = alVar1;
  }
  local_98 = SUB168(*in,0);
  alVar1 = (__m128i)pmovsxwd((undefined1  [16])*in,local_98);
  *in = alVar1;
  local_a8 = SUB168(in[1],0);
  alVar1 = (__m128i)pmovsxwd((undefined1  [16])in[1],local_a8);
  in[1] = alVar1;
  local_b8 = SUB168(in[2],0);
  alVar1 = (__m128i)pmovsxwd((undefined1  [16])in[2],local_b8);
  in[2] = alVar1;
  local_c8 = SUB168(in[3],0);
  alVar1 = (__m128i)pmovsxwd((undefined1  [16])in[3],local_c8);
  in[3] = alVar1;
  local_18 = (int)(*in)[0];
  uStack_14 = (undefined4)((ulong)(*in)[0] >> 0x20);
  uStack_10 = (undefined4)(*in)[1];
  uStack_c = (undefined4)((ulong)(*in)[1] >> 0x20);
  *(int *)*in = local_18 << shift;
  *(undefined4 *)((long)*in + 4) = uStack_14;
  *(undefined4 *)(*in + 1) = uStack_10;
  *(undefined4 *)((long)*in + 0xc) = uStack_c;
  local_38 = (int)in[1][0];
  uStack_34 = (undefined4)((ulong)in[1][0] >> 0x20);
  uStack_30 = (undefined4)in[1][1];
  uStack_2c = (undefined4)((ulong)in[1][1] >> 0x20);
  *(int *)in[1] = local_38 << shift;
  *(undefined4 *)((long)in[1] + 4) = uStack_34;
  *(undefined4 *)(in[1] + 1) = uStack_30;
  *(undefined4 *)((long)in[1] + 0xc) = uStack_2c;
  local_58 = (int)in[2][0];
  uStack_54 = (undefined4)((ulong)in[2][0] >> 0x20);
  uStack_50 = (undefined4)in[2][1];
  uStack_4c = (undefined4)((ulong)in[2][1] >> 0x20);
  *(int *)in[2] = local_58 << shift;
  *(undefined4 *)((long)in[2] + 4) = uStack_54;
  *(undefined4 *)(in[2] + 1) = uStack_50;
  *(undefined4 *)((long)in[2] + 0xc) = uStack_4c;
  flipud_local = (int)in[3][0];
  stride_local = (int)((ulong)in[3][0] >> 0x20);
  in_local._0_4_ = (undefined4)in[3][1];
  in_local._4_4_ = (undefined4)((ulong)in[3][1] >> 0x20);
  *(int *)in[3] = flipud_local << shift;
  *(int *)((long)in[3] + 4) = stride_local;
  *(undefined4 *)(in[3] + 1) = in_local._0_4_;
  *(undefined4 *)((long)in[3] + 0xc) = in_local._4_4_;
  return;
}

Assistant:

static inline void load_buffer_4x4(const int16_t *input, __m128i *in,
                                   int stride, int flipud, int fliplr,
                                   int shift) {
  if (!flipud) {
    in[0] = _mm_loadl_epi64((const __m128i *)(input + 0 * stride));
    in[1] = _mm_loadl_epi64((const __m128i *)(input + 1 * stride));
    in[2] = _mm_loadl_epi64((const __m128i *)(input + 2 * stride));
    in[3] = _mm_loadl_epi64((const __m128i *)(input + 3 * stride));
  } else {
    in[0] = _mm_loadl_epi64((const __m128i *)(input + 3 * stride));
    in[1] = _mm_loadl_epi64((const __m128i *)(input + 2 * stride));
    in[2] = _mm_loadl_epi64((const __m128i *)(input + 1 * stride));
    in[3] = _mm_loadl_epi64((const __m128i *)(input + 0 * stride));
  }

  if (fliplr) {
    in[0] = _mm_shufflelo_epi16(in[0], 0x1b);
    in[1] = _mm_shufflelo_epi16(in[1], 0x1b);
    in[2] = _mm_shufflelo_epi16(in[2], 0x1b);
    in[3] = _mm_shufflelo_epi16(in[3], 0x1b);
  }

  in[0] = _mm_cvtepi16_epi32(in[0]);
  in[1] = _mm_cvtepi16_epi32(in[1]);
  in[2] = _mm_cvtepi16_epi32(in[2]);
  in[3] = _mm_cvtepi16_epi32(in[3]);

  in[0] = _mm_slli_epi32(in[0], shift);
  in[1] = _mm_slli_epi32(in[1], shift);
  in[2] = _mm_slli_epi32(in[2], shift);
  in[3] = _mm_slli_epi32(in[3], shift);
}